

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::verifyResourceIndexQuery
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resourceList,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *referenceResources,GLuint program)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  undefined4 uVar2;
  pointer pbVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  pointer pbVar10;
  long lVar11;
  long lVar12;
  string queryString;
  byte local_1fc;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  uVar2 = *(undefined4 *)
           ((anonymous_namespace)::
            getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
           (long)(int)this->m_programInterface * 4);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying GetProgramResourceIndex returns correct indices for resource names.",0x4d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pbVar10 = (referenceResources->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(referenceResources->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) >> 5) < 1) {
    local_1fc = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar12 = 0;
    lVar11 = 0;
    local_1fc = 0;
    do {
      uVar7 = (**(code **)(lVar9 + 0x9a8))
                        (program,uVar2,*(undefined8 *)((long)&(pbVar10->_M_dataplus)._M_p + lVar12))
      ;
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"query resource index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x449);
      if (uVar7 == 0xffffffff) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Error, for active resource \"",0x1c);
        pbVar10 = (referenceResources->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,*(char **)((long)&(pbVar10->_M_dataplus)._M_p + lVar12),
                   *(long *)((long)&pbVar10->_M_string_length + lVar12));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"\" got index GL_INVALID_INDEX.",0x1d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0052f6b6:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        local_1fc = 1;
      }
      else {
        pbVar10 = (resourceList->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(resourceList->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) >> 5)
            <= (int)uVar7) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),"Error, for active resource \"",0x1c);
          pbVar10 = (referenceResources->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     *(char **)((long)&(pbVar10->_M_dataplus)._M_p + lVar12),
                     *(long *)((long)&pbVar10->_M_string_length + lVar12));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),"\" got index ",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8)," (larger or equal to GL_ACTIVE_RESOURCES).",0x2a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0052f6b6;
        }
        pbVar3 = (referenceResources->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar4 = pbVar10[uVar7]._M_string_length;
        if ((sVar4 != *(size_t *)((long)&pbVar3->_M_string_length + lVar12)) ||
           ((sVar4 != 0 &&
            (iVar6 = bcmp(pbVar10[uVar7]._M_dataplus._M_p,
                          *(void **)((long)&(pbVar3->_M_dataplus)._M_p + lVar12),sVar4), iVar6 != 0)
            ))) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Error, for active resource \"",0x1c);
          pbVar10 = (referenceResources->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,*(char **)((long)&(pbVar10->_M_dataplus)._M_p + lVar12),
                     *(long *)((long)&pbVar10->_M_string_length + lVar12));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\" got index (index = ",0x15);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") of another resource (",0x17);
          pbVar10 = (resourceList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,pbVar10[uVar7]._M_dataplus._M_p,
                     pbVar10[uVar7]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          local_1fc = 1;
        }
      }
      lVar11 = lVar11 + 1;
      pbVar10 = (referenceResources->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (lVar11 < (int)((ulong)((long)(referenceResources->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pbVar10) >> 5));
  }
  if ((this->m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING) &&
     (pbVar10 = (referenceResources->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(referenceResources->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) >> 5))) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[0]","");
      bVar5 = de::endsWith((string *)((long)&(pbVar10->_M_dataplus)._M_p + lVar11),
                           (string *)local_1b0);
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      if (bVar5) {
        std::__cxx11::string::substr
                  ((ulong)&local_1d0,
                   (long)&(((referenceResources->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11)
        ;
        uVar7 = (**(code **)(lVar9 + 0x9a8))(program,uVar2,local_1d0);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,"query resource index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x466);
        if (uVar7 == 0xffffffff) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Error, query for \"",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,(char *)local_1d0,local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\" resulted in index GL_INVALID_INDEX.",0x25);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0052fa67:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          local_1fc = 1;
        }
        else {
          pbVar10 = (resourceList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(resourceList->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) >> 5)
              <= (int)uVar7) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Error, query for \"",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_1d0,local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"\" resulted in index ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," (larger or equal to GL_ACTIVE_RESOURCES).",0x2a);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0052fa67;
          }
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,local_1d0,(long)local_1d0 + local_1c8);
          std::__cxx11::string::append((char *)local_1b0);
          pbVar10 = pbVar10 + uVar7;
          sVar4 = pbVar10->_M_string_length;
          bVar5 = true;
          if (sVar4 == local_1b0._8_8_) {
            if (sVar4 == 0) {
              bVar5 = false;
            }
            else {
              iVar6 = bcmp((pbVar10->_M_dataplus)._M_p,(void *)local_1b0._0_8_,sVar4);
              bVar5 = iVar6 != 0;
            }
          }
          if ((TestLog *)local_1b0._0_8_ != local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1))
            ;
          }
          if (bVar5) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Error, query for \"",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_1d0,local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"\" got index (index = ",0x15);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") of another resource (\"",0x18);
            pbVar10 = (resourceList->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,pbVar10[uVar7]._M_dataplus._M_p,
                       pbVar10[uVar7]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\").",3);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0052fa67;
          }
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
      }
      lVar12 = lVar12 + 1;
      pbVar10 = (referenceResources->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x20;
    } while (lVar12 < (int)((ulong)((long)(referenceResources->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pbVar10) >> 5));
  }
  return (bool)(~local_1fc & 1);
}

Assistant:

bool ResourceListTestCase::verifyResourceIndexQuery (const std::vector<std::string>& resourceList, const std::vector<std::string>& referenceResources, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	bool					error				= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying GetProgramResourceIndex returns correct indices for resource names." << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
	{
		const glw::GLuint index = gl.getProgramResourceIndex(program, programInterface, referenceResources[ndx].c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (index == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if ((int)index >= (int)resourceList.size())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if (resourceList[index] != referenceResources[ndx])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index (index = " << index << ") of another resource (" << resourceList[index] << ")." << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Query for "name" should match "name[0]" except for XFB

	if (m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING)
	{
		for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
		{
			if (de::endsWith(referenceResources[ndx], "[0]"))
			{
				const std::string	queryString	= referenceResources[ndx].substr(0, referenceResources[ndx].length()-3);
				const glw::GLuint	index		= gl.getProgramResourceIndex(program, programInterface, queryString.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

				if (index == GL_INVALID_INDEX)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if ((int)index >= (int)resourceList.size())
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if (resourceList[index] != queryString + "[0]")
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" got index (index = " << index << ") of another resource (\"" << resourceList[index] << "\")." << tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}
	}

	return !error;
}